

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

uint64_t to_msr_tw_atom(double seconds,double time_units)

{
  uint64_t uVar1;
  ulong uVar2;
  double dVar3;
  
  if (seconds <= 0.0) {
    __assert_fail("seconds > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0xcf,"uint64_t to_msr_tw_atom(double, double)");
  }
  if (0.0 < time_units) {
    if (seconds < 1.0) {
      to_msr_tw_atom_cold_2();
      uVar1 = 0;
    }
    else if (127.0 < seconds / time_units) {
      to_msr_tw_atom_cold_1();
      uVar1 = 0x7f;
    }
    else {
      dVar3 = seconds / time_units + 0.5;
      uVar2 = (ulong)dVar3;
      uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
    return uVar1;
  }
  __assert_fail("time_units > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0xd0,"uint64_t to_msr_tw_atom(double, double)");
}

Assistant:

static uint64_t to_msr_tw_atom(double seconds, double time_units) {
  assert(seconds > 0);
  assert(time_units > 0);
  // time_units should be 1.0, but conceivably could be any whole number in 4 bit range: [1, 15]
  static const uint64_t MSR_TIME_MAX = 0x7F;
  const double t = seconds / time_units;
  uint64_t bits;
  if (seconds < 1) {
    raplcap_log(WARN, "Time window too small: %.12f sec, using min: %.12f sec\n", seconds, 1.0);
    bits = 0x0; // interpreted as 1 second
  } else if (t > (double) MSR_TIME_MAX) {
    raplcap_log(WARN, "Time window too large: %.12f sec, using max: %.12f sec\n", seconds, MSR_TIME_MAX * time_units);
    bits = MSR_TIME_MAX;
  } else {
    // round to nearest MSR value ((s + u/2) / u)
    bits = (uint64_t) (t + 0.5);
  }
  raplcap_log(DEBUG, "to_msr_tw_atom: seconds=%.12f, bits=0x%02lX\n", seconds, bits);
  return bits;
}